

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::iterationAnalysisData(HEkkDual *this)

{
  long lVar1;
  long in_RDI;
  double dVar2;
  HighsSimplexInfo *info;
  double cost_scale_factor;
  
  dVar2 = pow(2.0,(double)-*(int *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x218));
  lVar1 = *(long *)(in_RDI + 0x10);
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0xf8) = *(undefined4 *)(lVar1 + 0x2808);
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0xfc) = *(undefined4 *)(in_RDI + 0xac);
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x100) = *(undefined4 *)(in_RDI + 0xe4);
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x104) =
       *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x36f8);
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x108) = *(undefined4 *)(in_RDI + 4);
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x10c) = *(undefined4 *)(in_RDI + 0x7b0);
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x110) = *(undefined4 *)(in_RDI + 0x7b4);
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x114) = *(undefined4 *)(in_RDI + 0x7bc);
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x118) = *(undefined4 *)(in_RDI + 0xe8);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x140) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x148) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x150) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x160) = *(undefined8 *)(in_RDI + 0x7c0);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x168) = *(undefined8 *)(in_RDI + 2000);
  *(double *)(*(long *)(in_RDI + 0x40) + 0x170) = *(double *)(in_RDI + 0x7c8) * dVar2;
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x178) = *(undefined8 *)(in_RDI + 0x7d8);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x180) = *(undefined8 *)(in_RDI + 0x7e0);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x188) = *(undefined8 *)(lVar1 + 0x2830);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 400) = *(undefined8 *)(in_RDI + 0x7e8);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x158) =
       *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x3848);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x198) = *(undefined8 *)(lVar1 + 0x2958);
  if (*(int *)(in_RDI + 0xe4) == 2) {
    *(double *)(*(long *)(in_RDI + 0x40) + 0x198) =
         (double)*(int *)(*(long *)(in_RDI + 0x10) + 0x2288) *
         *(double *)(*(long *)(in_RDI + 0x40) + 0x198);
  }
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x1a0) = *(undefined4 *)(lVar1 + 0x28d8);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x1a8) = *(undefined8 *)(lVar1 + 0x28e8);
  if (*(int *)(in_RDI + 0xe4) == 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x1a4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x1b8);
    *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x1b0) =
         *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x1c8);
  }
  else {
    *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x1a4) = *(undefined4 *)(lVar1 + 0x28f0);
    *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x1b0) = *(undefined8 *)(lVar1 + 0x2900);
  }
  if ((*(int *)(in_RDI + 0xac) == 1) && (*(int *)(in_RDI + 4) == 0)) {
    *(int *)(*(long *)(in_RDI + 0x40) + 0x1d0) = *(int *)(*(long *)(in_RDI + 0x40) + 0x1d0) + 1;
  }
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x1d8) = *(undefined8 *)(lVar1 + 0x2840);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x1e0) = *(undefined8 *)(lVar1 + 0x2848);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x1e8) = *(undefined8 *)(lVar1 + 0x2850);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x1f0) = *(undefined8 *)(lVar1 + 0x2858);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x200) = *(undefined8 *)(lVar1 + 0x2868);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x208) = *(undefined8 *)(lVar1 + 0x2870);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x210) = *(undefined8 *)(lVar1 + 0x2878);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x218) = *(undefined8 *)(lVar1 + 0x2880);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x220) = *(undefined8 *)(lVar1 + 0x2888);
  *(undefined4 *)(*(long *)(in_RDI + 0x40) + 0x228) = *(undefined4 *)(lVar1 + 0x28a8);
  *(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x230) = *(undefined8 *)(lVar1 + 0x28b0);
  return;
}

Assistant:

void HEkkDual::iterationAnalysisData() {
  double cost_scale_factor =
      pow(2.0, -ekk_instance_.options_->cost_scale_factor);
  HighsSimplexInfo& info = ekk_instance_.info_;
  analysis->simplex_strategy = info.simplex_strategy;
  analysis->edge_weight_mode = edge_weight_mode;
  analysis->solve_phase = solve_phase;
  analysis->simplex_iteration_count = ekk_instance_.iteration_count_;
  analysis->devex_iteration_count = num_devex_iterations;
  analysis->pivotal_row_index = row_out;
  analysis->leaving_variable = variable_out;
  analysis->entering_variable = variable_in;
  analysis->rebuild_reason = rebuild_reason;
  analysis->reduced_rhs_value = 0;
  analysis->reduced_cost_value = 0;
  analysis->edge_weight = 0;
  analysis->primal_delta = delta_primal;
  analysis->primal_step = theta_primal;
  analysis->dual_step = theta_dual * cost_scale_factor;
  analysis->pivot_value_from_column = alpha_col;
  analysis->pivot_value_from_row = alpha_row;
  analysis->factor_pivot_threshold = info.factor_pivot_threshold;
  analysis->numerical_trouble = numericalTrouble;
  analysis->edge_weight_error = ekk_instance_.edge_weight_error_;
  analysis->objective_value = info.updated_dual_objective_value;
  // Since maximization is achieved by minimizing the LP with negated
  // costs, in phase 2 the dual objective value is negated, so flip
  // its sign according to the LP sense
  if (solve_phase == kSolvePhase2)
    analysis->objective_value *= (HighsInt)ekk_instance_.lp_.sense_;
  analysis->num_primal_infeasibility = info.num_primal_infeasibilities;
  analysis->sum_primal_infeasibility = info.sum_primal_infeasibilities;
  if (solve_phase == kSolvePhase1) {
    analysis->num_dual_infeasibility =
        analysis->num_dual_phase_1_lp_dual_infeasibility;
    analysis->sum_dual_infeasibility =
        analysis->sum_dual_phase_1_lp_dual_infeasibility;
  } else {
    analysis->num_dual_infeasibility = info.num_dual_infeasibilities;
    analysis->sum_dual_infeasibility = info.sum_dual_infeasibilities;
  }
  if ((edge_weight_mode == EdgeWeightMode::kDevex) &&
      (num_devex_iterations == 0))
    analysis->num_devex_framework++;
  analysis->col_aq_density = info.col_aq_density;
  analysis->row_ep_density = info.row_ep_density;
  analysis->row_ap_density = info.row_ap_density;
  analysis->row_DSE_density = info.row_DSE_density;
  analysis->col_basic_feasibility_change_density =
      info.col_basic_feasibility_change_density;
  analysis->row_basic_feasibility_change_density =
      info.row_basic_feasibility_change_density;
  analysis->col_BFRT_density = info.col_BFRT_density;
  analysis->primal_col_density = info.primal_col_density;
  analysis->dual_col_density = info.dual_col_density;
  analysis->num_costly_DSE_iteration = info.num_costly_DSE_iteration;
  analysis->costly_DSE_measure = info.costly_DSE_measure;
  //  analysis-> = info.;
}